

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall
Console::Prompt::Private::concharArrayToString(Private *this,conchar *data,usize len,String *result)

{
  uint32 *puVar1;
  conchar *pcVar2;
  usize uVar3;
  Data *pDVar4;
  conchar cVar5;
  ulong minCapacity;
  usize minCapacity_00;
  conchar *i;
  
  String::clear(result);
  if (this->utf8 == true) {
    uVar3 = result->data->len;
    minCapacity = len * 4;
    if (len * 4 < uVar3) {
      minCapacity = uVar3;
    }
    String::detach(result,uVar3,minCapacity);
    if (0 < (long)len) {
      puVar1 = data + len;
      do {
        Unicode::append(*data,result);
        data = data + 1;
      } while (data < puVar1);
    }
  }
  else {
    uVar3 = result->data->len;
    minCapacity_00 = len;
    if (len < uVar3) {
      minCapacity_00 = uVar3;
    }
    String::detach(result,uVar3,minCapacity_00);
    if (0 < (long)len) {
      pcVar2 = data + len;
      do {
        cVar5 = *data;
        uVar3 = result->data->len;
        String::detach(result,uVar3,uVar3 + 1);
        result->data->str[result->data->len] = (char)cVar5;
        pDVar4 = result->data;
        pDVar4->len = uVar3 + 1;
        pDVar4->str[uVar3 + 1] = '\0';
        data = data + 1;
      } while (data < pcVar2);
    }
  }
  return;
}

Assistant:

void concharArrayToString(const conchar* data, usize len, String& result)
  {
    result.clear();
#ifdef _MSC_VER
    result.append(data, len);
#else
    if(utf8)
    {
      result.reserve(len * sizeof(uint32));
      Unicode::append(data, len, result);
    }
    else
    {
      result.reserve(len);
      for(const conchar* i = data, * end = data + len; i < end; ++i)
        result.append((const char&)*i);
    }
#endif
  }